

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPSocket.cpp
# Opt level: O0

void __thiscall
hwnet::TCPSocket::TCPSocket(TCPSocket *this,Poller *poller_,ThreadPool *pool_,int fd)

{
  rep rVar1;
  linklist *local_40;
  int fd_local;
  ThreadPool *pool__local;
  Poller *poller__local;
  TCPSocket *this_local;
  
  Task::Task(&this->super_Task);
  Channel::Channel(&this->super_Channel);
  std::enable_shared_from_this<hwnet::TCPSocket>::enable_shared_from_this
            (&this->super_enable_shared_from_this<hwnet::TCPSocket>);
  (this->super_Task)._vptr_Task = (_func_int **)&PTR_Do_001858d8;
  (this->super_Channel)._vptr_Channel = (_func_int **)&DAT_00185910;
  std::__cxx11::
  list<std::shared_ptr<hwnet::Buffer>,_std::allocator<std::shared_ptr<hwnet::Buffer>_>_>::list
            (&this->recvList);
  local_40 = this->sendLists;
  do {
    linklist::linklist(local_40);
    local_40 = local_40 + 1;
  } while (local_40 != (linklist *)&this->slistIdx);
  this->fd = fd;
  this->err = 0;
  std::function<void_(const_std::shared_ptr<hwnet::TCPSocket>_&)>::function
            (&this->flushCallback_,(nullptr_t)0x0);
  std::function<void_(const_std::shared_ptr<hwnet::TCPSocket>_&,_int)>::function
            (&this->errorCallback_,(nullptr_t)0x0);
  std::function<void_(const_std::shared_ptr<hwnet::TCPSocket>_&)>::function
            (&this->closeCallback_,(nullptr_t)0x0);
  std::function<void_(const_std::shared_ptr<hwnet::TCPSocket>_&,_unsigned_long)>::function
            (&this->highWaterCallback_);
  std::
  function<void_(const_std::shared_ptr<hwnet::TCPSocket>_&,_const_std::shared_ptr<hwnet::Buffer>_&,_unsigned_long)>
  ::function(&this->recvCallback_);
  this->readable = false;
  this->readableVer = 0;
  this->writeable = false;
  this->writeableVer = 0;
  std::atomic<bool>::atomic(&this->closed,false);
  this->closedOnFlush = false;
  this->shutdown = false;
  this->doing = false;
  this->socketError = false;
  this->poller_ = poller_;
  std::mutex::mutex(&this->mtx);
  this->bytes4Send = 0;
  this->highWaterSize = 0;
  Addr::Addr(&this->remoteAddr);
  Addr::Addr(&this->localAddr);
  this->pool_ = pool_;
  any::any(&this->ud);
  std::atomic<bool>::atomic(&this->started,false);
  std::__cxx11::list<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::list
            (&this->closures);
  std::weak_ptr<hwnet::util::Timer>::weak_ptr(&this->timer);
  this->recvTimeout = 0;
  std::function<void_(const_std::shared_ptr<hwnet::TCPSocket>_&)>::function
            (&this->recvTimeoutCallback_,(nullptr_t)0x0);
  rVar1 = std::chrono::_V2::steady_clock::now();
  (this->lastRecvTime).__d.__r = rVar1;
  this->sendTimeout = 0;
  std::function<void_(const_std::shared_ptr<hwnet::TCPSocket>_&)>::function
            (&this->sendTimeoutCallback_,(nullptr_t)0x0);
  rVar1 = std::chrono::_V2::steady_clock::now();
  (this->lastSendTime).__d.__r = rVar1;
  this->slistIdx = 0;
  this->ptrSendlist = this->sendLists + this->slistIdx;
  return;
}

Assistant:

TCPSocket::TCPSocket(Poller *poller_,ThreadPool *pool_,int fd):fd(fd),err(0),flushCallback_(nullptr),
	errorCallback_(nullptr),closeCallback_(nullptr),readable(false),readableVer(0),writeable(false),
	writeableVer(0),closed(false),closedOnFlush(false),shutdown(false),doing(false),socketError(false),poller_(poller_),
	bytes4Send(0),highWaterSize(0),pool_(pool_),started(false),
	recvTimeout(0),recvTimeoutCallback_(nullptr),lastRecvTime(std::chrono::steady_clock::now()),
	sendTimeout(0),sendTimeoutCallback_(nullptr),lastSendTime(std::chrono::steady_clock::now()) {
		slistIdx = 0;
		ptrSendlist = &sendLists[slistIdx];		
#ifdef GATHER_RECV
		rlistIdx = 0;
		ptrRecvlist = &recvLists[rlistIdx];		
#endif	

#ifdef USE_SSL
		this->ssl = nullptr;
#endif

	}